

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * GetNearestAirportId_abi_cxx11_
                   (string *__return_storage_ptr__,positionTy *_pos,positionTy *outApPos)

{
  undefined1 auVar1 [16];
  int iVar2;
  float alt;
  float lon;
  float lat;
  char airportId [33];
  
  airportId[0x10] = '\0';
  airportId[0x11] = '\0';
  airportId[0x12] = '\0';
  airportId[0x13] = '\0';
  airportId[0x14] = '\0';
  airportId[0x15] = '\0';
  airportId[0x16] = '\0';
  airportId[0x17] = '\0';
  airportId[0x18] = '\0';
  airportId[0x19] = '\0';
  airportId[0x1a] = '\0';
  airportId[0x1b] = '\0';
  airportId[0x1c] = '\0';
  airportId[0x1d] = '\0';
  airportId[0x1e] = '\0';
  airportId[0x1f] = '\0';
  airportId[0] = '\0';
  airportId[1] = '\0';
  airportId[2] = '\0';
  airportId[3] = '\0';
  airportId[4] = '\0';
  airportId[5] = '\0';
  airportId[6] = '\0';
  airportId[7] = '\0';
  airportId[8] = '\0';
  airportId[9] = '\0';
  airportId[10] = '\0';
  airportId[0xb] = '\0';
  airportId[0xc] = '\0';
  airportId[0xd] = '\0';
  airportId[0xe] = '\0';
  airportId[0xf] = '\0';
  airportId[0x20] = '\0';
  lat = (float)_pos->_lat;
  lon = (float)_pos->_lon;
  iVar2 = XPLMFindNavAid(0,0,&lat,&lon,0,1);
  if (iVar2 != 0) {
    alt = 0.0;
    XPLMGetNavAidInfo(iVar2,0,&lat,&lon,&alt,0,0,airportId,0,0);
    if (outApPos != (positionTy *)0x0) {
      auVar1._8_4_ = SUB84((double)lon,0);
      auVar1._0_8_ = (double)lat;
      auVar1._12_4_ = (int)((ulong)(double)lon >> 0x20);
      outApPos->_lat = (double)lat;
      outApPos->_lon = (double)auVar1._8_8_;
      outApPos->_alt = (double)alt;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,airportId,(allocator<char> *)&alt);
  return __return_storage_ptr__;
}

Assistant:

std::string GetNearestAirportId (const positionTy& _pos,
                                 positionTy* outApPos)
{
    char airportId[33] = "";

    // Find the nearest airport
    float lat = (float)_pos.lat();
    float lon = (float)_pos.lon();
    XPLMNavRef navRef = XPLMFindNavAid(nullptr, nullptr,
                                       &lat, &lon, nullptr,
                                       xplm_Nav_Airport);
    if (navRef) {
        // fetch airport info
        float alt = 0.0f;
        XPLMGetNavAidInfo(navRef, nullptr, &lat, &lon, &alt, nullptr, nullptr,
                          airportId, nullptr, nullptr);
        // fill output structure
        if (outApPos) {
            outApPos->lat() = lat;
            outApPos->lon() = lon;
            outApPos->alt_m() = alt;
        }
    }
    
    // return the id
    return airportId;
}